

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFanout.c
# Opt level: O2

void Gia_ManStaticFanoutTest(Gia_Man_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pObj_00;
  int iVar3;
  int v;
  
  Gia_ManStaticFanoutStart(p);
  for (v = 0; v < p->nObjs; v = v + 1) {
    pObj = Gia_ManObj(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    Gia_ObjPrint(p,pObj);
    iVar3 = 0;
    printf("   Fanouts : ");
    while( true ) {
      iVar1 = Gia_ObjFanoutNum(p,pObj);
      if (iVar1 <= iVar3) break;
      iVar1 = Gia_ObjId(p,pObj);
      p_00 = p->vFanout;
      iVar1 = Gia_ObjFoffsetId(p,iVar1);
      iVar1 = Vec_IntEntry(p_00,iVar1 + iVar3);
      pObj_00 = Gia_ManObj(p,iVar1);
      uVar2 = Gia_ObjId(p,pObj_00);
      printf("%5d ",(ulong)uVar2);
      iVar3 = iVar3 + 1;
    }
    putchar(10);
  }
  Gia_ManStaticFanoutStop(p);
  return;
}

Assistant:

void Gia_ManStaticFanoutTest( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pFanout;
    int i, k;
    Gia_ManStaticFanoutStart( p );
    Gia_ManForEachObj( p, pObj, i )
    {
        Gia_ObjPrint( p, pObj );
        printf( "   Fanouts : " );
        Gia_ObjForEachFanoutStatic( p, pObj, pFanout, k )
            printf( "%5d ", Gia_ObjId(p, pFanout) );
        printf( "\n" );
    }
    Gia_ManStaticFanoutStop( p );
}